

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.hpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderMaxUniformBlocksTest::~GeometryShaderMaxUniformBlocksTest
          (GeometryShaderMaxUniformBlocksTest *this)

{
  ~GeometryShaderMaxUniformBlocksTest(this);
  operator_delete(this,0x390);
  return;
}

Assistant:

virtual ~GeometryShaderMaxUniformBlocksTest()
	{
	}